

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thermalizer.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  long *plVar2;
  SnapshotManager *pSVar3;
  void *pvVar4;
  undefined8 uVar5;
  RealType RVar6;
  RealType RVar7;
  RealType in_stack_00000048;
  Velocitizer *in_stack_00000050;
  RealType lambda;
  RealType epsilon;
  RealType energy;
  RealType charge_temperature;
  RealType temperature;
  DumpWriter *writer;
  RealType instKE;
  RealType instPE;
  ForceManager *forceMan;
  unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> veloSet;
  Thermo thermo;
  SimInfo *info;
  SimCreator creator;
  string outputFileName;
  string inputFileName;
  gengetopt_args_info args_info;
  undefined1 in_stack_000107f7;
  string *in_stack_000107f8;
  SimCreator *in_stack_00010800;
  char **in_stack_fffffffffffffdc8;
  DumpWriter *in_stack_fffffffffffffdd0;
  SimInfo **in_stack_fffffffffffffde8;
  errorStruct *peVar8;
  errorStruct *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffe48;
  errorStruct *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe70;
  SimInfo *in_stack_fffffffffffffe78;
  ForceManager *in_stack_fffffffffffffe80;
  Thermo local_150;
  SimInfo *local_148;
  string local_108 [32];
  string local_e8 [16];
  RealType in_stack_ffffffffffffff28;
  Velocitizer *in_stack_ffffffffffffff30;
  char *local_b8;
  char *local_a0;
  double local_88;
  double local_70;
  double local_58;
  int local_38;
  int local_30;
  int local_2c;
  int local_28;
  undefined8 *local_20;
  int local_18;
  
  std::__cxx11::string::string(local_e8);
  std::__cxx11::string::string(local_108);
  iVar1 = cmdline_parser((int)((ulong)in_stack_fffffffffffffdd0 >> 0x20),in_stack_fffffffffffffdc8,
                         (gengetopt_args_info *)0x1242c7);
  if (iVar1 == 0) {
    if (local_38 == 0) {
      if (local_18 == 0) {
        in_stack_fffffffffffffe50 = &painCave;
        snprintf(painCave.errMsg,2000,"No input file name was specified on the command line");
        in_stack_fffffffffffffe50->severity = 1;
        in_stack_fffffffffffffe50->isFatal = 1;
        simError();
      }
      else {
        std::__cxx11::string::operator=(local_e8,(char *)*local_20);
      }
    }
    else {
      std::__cxx11::string::operator=(local_e8,local_b8);
    }
    std::__cxx11::string::operator=(local_108,local_a0);
    iVar1 = std::__cxx11::string::compare(local_108);
    if (iVar1 == 0) {
      snprintf(painCave.errMsg,2000,"Input and Output File names should be different!");
      painCave.severity = 1;
      painCave.isFatal = 1;
      simError();
    }
    OpenMD::SimCreator::SimCreator((SimCreator *)0x12442c);
    local_148 = OpenMD::SimCreator::createSim
                          (in_stack_00010800,in_stack_000107f8,(bool)in_stack_000107f7);
    OpenMD::Thermo::Thermo(&local_150,local_148);
    std::make_unique<OpenMD::Velocitizer,OpenMD::SimInfo*&>(in_stack_fffffffffffffde8);
    plVar2 = (long *)operator_new(0xc80);
    OpenMD::ForceManager::ForceManager(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    std::unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>::operator->
              ((unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *)
               0x1244c4);
    OpenMD::Velocitizer::removeComDrift((Velocitizer *)in_stack_fffffffffffffe50);
    (**(code **)(*plVar2 + 0x10))();
    RVar6 = OpenMD::Thermo::getPotential((Thermo *)in_stack_fffffffffffffdd0);
    RVar7 = OpenMD::Thermo::getKinetic((Thermo *)in_stack_fffffffffffffdf0);
    pSVar3 = OpenMD::SimInfo::getSnapshotManager(local_148);
    (*pSVar3->_vptr_SnapshotManager[2])();
    pvVar4 = operator_new(0x60);
    OpenMD::DumpWriter::DumpWriter
              ((DumpWriter *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
               in_stack_fffffffffffffe70);
    if (pvVar4 == (void *)0x0) {
      snprintf(painCave.errMsg,2000,"error in creating DumpWriter");
      painCave.severity = 1;
      painCave.isFatal = 1;
      simError();
    }
    if (local_30 != 0) {
      if (local_88 < 0.0) {
        snprintf(painCave.errMsg,2000,"Temperatures must be positive numbers.");
        painCave.severity = 1;
        painCave.isFatal = 1;
        simError();
      }
      std::unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>::operator->
                ((unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *)
                 0x1246d8);
      OpenMD::Velocitizer::randomize(in_stack_00000050,in_stack_00000048);
    }
    if (local_28 != 0) {
      if (local_58 < 0.0) {
        in_stack_fffffffffffffdf0 = &painCave;
        snprintf(painCave.errMsg,2000,"Temperatures must be positive numbers.");
        in_stack_fffffffffffffdf0->severity = 1;
        in_stack_fffffffffffffdf0->isFatal = 1;
        simError();
      }
      std::unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>::operator->
                ((unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *)
                 0x124769);
      OpenMD::Velocitizer::randomizeChargeVelocity
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
    if (local_2c != 0) {
      if (RVar6 <= local_70) {
        if (RVar7 < 1e-06) {
          std::unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>::
          operator->((unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *)
                     0x12488e);
          OpenMD::Velocitizer::randomize(in_stack_00000050,in_stack_00000048);
          RVar7 = OpenMD::Thermo::getKinetic((Thermo *)in_stack_fffffffffffffdf0);
          sqrt((local_70 - RVar6) / RVar7);
          std::unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>::
          operator->((unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *)
                     0x124902);
          OpenMD::Velocitizer::scale
                    ((Velocitizer *)in_stack_fffffffffffffe50,
                     (RealType)CONCAT44(iVar1,in_stack_fffffffffffffe48));
        }
        else {
          sqrt((local_70 - RVar6) / RVar7);
          std::unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>::
          operator->((unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *)
                     0x124869);
          OpenMD::Velocitizer::scale
                    ((Velocitizer *)in_stack_fffffffffffffe50,
                     (RealType)CONCAT44(iVar1,in_stack_fffffffffffffe48));
        }
      }
      else {
        peVar8 = &painCave;
        snprintf(painCave.errMsg,2000,"Energy must be larger than current potential energy.");
        peVar8->severity = 1;
        peVar8->isFatal = 1;
        simError();
      }
    }
    OpenMD::DumpWriter::writeDump((DumpWriter *)0x124928);
    if (pvVar4 != (void *)0x0) {
      OpenMD::DumpWriter::~DumpWriter(in_stack_fffffffffffffdd0);
      operator_delete(pvVar4,0x60);
    }
    uVar5 = std::__cxx11::string::c_str();
    peVar8 = &painCave;
    snprintf(painCave.errMsg,2000,"A new OpenMD file called \"%s\" has been generated.\n",uVar5);
    peVar8->isFatal = 0;
    peVar8->severity = 3;
    simError();
    std::unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>::~unique_ptr
              ((unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *)peVar8)
    ;
    OpenMD::SimCreator::~SimCreator((SimCreator *)0x1249ca);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_e8);
    return 0;
  }
  cmdline_parser_print_help();
  exit(1);
}

Assistant:

int main(int argc, char* argv[]) {
  gengetopt_args_info args_info;
  std::string inputFileName;
  std::string outputFileName;

  // parse command line arguments
  if (cmdline_parser(argc, argv, &args_info) != 0) {
    cmdline_parser_print_help();
    exit(1);
  }

  // get input file name
  if (args_info.input_given) {
    inputFileName = args_info.input_arg;
  } else {
    if (args_info.inputs_num) {
      inputFileName = args_info.inputs[0];
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "No input file name was specified on the command line");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
  }

  // get output file name
  outputFileName = args_info.output_arg;

  if (!outputFileName.compare(inputFileName)) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Input and Output File names should be different!");
    painCave.severity = OPENMD_ERROR;
    painCave.isFatal  = 1;
    simError();
  }

  // Parse the input file, set up the system, and read the last frame:
  SimCreator creator;
  SimInfo* info = creator.createSim(inputFileName, true);

  // Important utility classes for computing system properties:
  Thermo thermo(info);

  std::unique_ptr<Velocitizer> veloSet {std::make_unique<Velocitizer>(info)};

  ForceManager* forceMan = new ForceManager(info);

  // Just in case we were passed a system that is on the move:
  veloSet->removeComDrift();
  forceMan->calcForces();

  RealType instPE = thermo.getPotential();
  RealType instKE = thermo.getKinetic();

  // Now that we have the information from the current frame, advance
  // the snapshot to make a modified frame:
  info->getSnapshotManager()->advance();

  // Create DumpWriter to hold the modified frame:
  DumpWriter* writer = new DumpWriter(info, outputFileName);
  if (writer == NULL) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "error in creating DumpWriter");
    painCave.severity = OPENMD_ERROR;
    painCave.isFatal  = 1;
    simError();
  }

  // If resampling temperature, we call the randomizer method:
  if (args_info.temperature_given) {
    RealType temperature = args_info.temperature_arg;

    if (temperature < 0.0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Temperatures must be positive numbers.");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    veloSet->randomize(temperature);
  }

  // If resampling charge temperature, we call the randomizeChargeVelocity
  // method
  if (args_info.chargetemperature_given) {
    RealType charge_temperature = args_info.chargetemperature_arg;

    if (charge_temperature < 0.0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Temperatures must be positive numbers.");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    veloSet->randomizeChargeVelocity(charge_temperature);
  }

  // If scaling total energy, scale only the kinetic:
  if (args_info.energy_given) {
    RealType energy  = args_info.energy_arg;
    RealType epsilon = 1e-6;
    RealType lambda  = 0.0;

    if (energy < instPE) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Energy must be larger than current potential energy.");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    } else {
      if (instKE >= epsilon) {
        lambda = sqrt((energy - instPE) / instKE);
        veloSet->scale(lambda);
      }
      // If the current kinetic energy is close to zero, we will
      // sample velocities from a 10K distribution and then
      // subsequently scale from 10K to the desired energy.
      else {
        veloSet->randomize(10.0);
        instKE = thermo.getKinetic();
        lambda = sqrt((energy - instPE) / instKE);
        veloSet->scale(lambda);
      }
    }
  }

  writer->writeDump();
  // deleting the writer will put the closing at the end of the dump file.
  delete writer;

  snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
           "A new OpenMD file called \"%s\" has been generated.\n",
           outputFileName.c_str());
  painCave.isFatal  = 0;
  painCave.severity = OPENMD_INFO;
  simError();
  return 0;
}